

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::FollowSharedDeps
          (cmComputeLinkDepends *this,size_t depender_index,cmLinkInterface *iface,
          bool follow_interface)

{
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar1;
  bool follow_interface_local;
  cmLinkInterface *iface_local;
  size_t depender_index_local;
  cmComputeLinkDepends *this_local;
  
  iface_local = (cmLinkInterface *)depender_index;
  depender_index_local = (size_t)this;
  pVar1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::insert
                    (&this->SharedDepFollowed,(value_type_conflict4 *)&iface_local);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (follow_interface) {
      QueueSharedDependencies
                (this,(size_t)iface_local,(vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
    }
    QueueSharedDependencies(this,(size_t)iface_local,&iface->SharedDeps);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::FollowSharedDeps(size_t depender_index,
                                            cmLinkInterface const* iface,
                                            bool follow_interface)
{
  // Follow dependencies if we have not followed them already.
  if (this->SharedDepFollowed.insert(depender_index).second) {
    if (follow_interface) {
      this->QueueSharedDependencies(depender_index, iface->Libraries);
    }
    this->QueueSharedDependencies(depender_index, iface->SharedDeps);
  }
}